

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void arm_post_translate_insn(DisasContext_conflict1 *dc)

{
  if ((dc->condjmp != 0) && ((dc->base).is_jmp == DISAS_NEXT)) {
    gen_set_label(dc->uc->tcg_ctx,dc->condlabel);
    dc->condjmp = 0;
  }
  translator_loop_temp_check_aarch64(&dc->base);
  return;
}

Assistant:

static void arm_post_translate_insn(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    if (dc->condjmp && !dc->base.is_jmp) {
        gen_set_label(tcg_ctx, dc->condlabel);
        dc->condjmp = 0;
    }
    translator_loop_temp_check(&dc->base);
}